

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  PS_UniMap *pPVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  uint uVar6;
  
  pPVar2 = table->maps;
  pPVar3 = pPVar2 + ((ulong)table->num_maps - 1);
  pPVar4 = (PS_UniMap *)0x0;
  while (pPVar2 <= pPVar3) {
    pPVar5 = pPVar2 + ((long)pPVar3 - (long)pPVar2 >> 4);
    if (pPVar5->unicode == unicode) goto LAB_0015548c;
    uVar6 = pPVar5->unicode & 0x7fffffff;
    pPVar1 = pPVar5;
    if (uVar6 != unicode) {
      pPVar1 = pPVar4;
    }
    pPVar4 = pPVar1;
    if (pPVar2 == pPVar3) break;
    if (uVar6 < unicode) {
      pPVar2 = pPVar5 + 1;
    }
    else {
      pPVar3 = pPVar5 + -1;
    }
  }
  pPVar5 = pPVar4;
  if (pPVar4 == (PS_UniMap *)0x0) {
    return 0;
  }
LAB_0015548c:
  return pPVar5->glyph_index;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *min, *max, *mid, *result = NULL;


    /* Perform a binary search on the table. */

    min = table->maps;
    max = min + table->num_maps - 1;

    while ( min <= max )
    {
      FT_UInt32  base_glyph;


      mid = min + ( ( max - min ) >> 1 );

      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( min == max )
        break;

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid - 1;
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }